

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

void __thiscall backend::codegen::RegAllocator::calc_live_intervals(RegAllocator *this)

{
  pointer puVar1;
  __uniq_ptr_data<arm::Inst,_std::default_delete<arm::Inst>,_true,_true> _Var2;
  undefined **ppuVar3;
  long lVar4;
  _Rb_tree_node_base *p_Var5;
  iterator __begin11;
  iterator __begin12;
  long *plVar6;
  uint local_168 [2];
  __hashtable *__h;
  _Rb_tree<int,std::pair<int_const,unsigned_int>,std::_Select1st<std::pair<int_const,unsigned_int>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_int>>>
  *local_158;
  undefined **local_150;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_148;
  undefined **local_140;
  undefined **local_138;
  undefined **local_130;
  undefined **local_128;
  undefined **local_120;
  undefined **local_118;
  pair<const_int,_unsigned_int> local_f8 [14];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id_str;
  
  local_158 = (_Rb_tree<int,std::pair<int_const,unsigned_int>,std::_Select1st<std::pair<int_const,unsigned_int>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_int>>>
               *)&this->point_bb_map;
  local_148 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
              &this->bl_points;
  __h = &(this->reg_affine)._M_h;
  local_168[0] = 0;
  local_118 = &PTR_display_001db900;
  local_120 = &PTR_display_001db940;
  local_128 = &PTR_display_001db980;
  local_130 = &PTR_display_001db9c0;
  local_138 = &PTR_display_001dba00;
  local_140 = &PTR_display_001dba40;
  local_150 = &PTR_display_001db748;
  do {
    puVar1 = (this->f->inst).
             super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->f->inst).
                      super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
        (ulong)(long)(int)local_168[0]) {
      return;
    }
    _Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
    super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
    super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl =
         puVar1[(int)local_168[0]]._M_t.
         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>;
    ppuVar3 = *(undefined ***)
               _Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>._M_t.
               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl;
    if (ppuVar3 != &PTR_display_001db880) {
      if (ppuVar3 == &PTR_display_001db8c0) {
        add_reg_read(this,*(Reg *)((long)_Var2.
                                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                         .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                  0x14),local_168[0]);
        add_reg_read(this,*(Reg *)((long)_Var2.
                                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                         .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                  0x18),local_168[0]);
        add_reg_read(this,*(Reg *)((long)_Var2.
                                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                         .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                  0x1c),local_168[0]);
      }
      else {
        if (ppuVar3 != local_118) {
          if (ppuVar3 == local_120) {
            if (*(int *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) - 6U < 3)
            {
              add_reg_write(this,*(Reg *)((long)_Var2.
                                                super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                                .super__Head_base<0UL,_arm::Inst_*,_false>.
                                                _M_head_impl + 0x10),local_168[0]);
              if ((((*(char *)((long)_Var2.
                                     super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                     .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x30)
                     == '\0') &&
                   (*(int *)((long)_Var2.
                                   super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                   .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 6
                   )) && (*(char *)((long)_Var2.
                                          super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                          .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                   0x2d) == '\0')) &&
                 (*(uint *)((long)_Var2.
                                  super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                                  _M_t.
                                  super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                  .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10) <
                  0x40)) {
                if (*(uint *)((long)_Var2.
                                    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                    .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x28)
                    < 0x40) {
                  id_str._M_dataplus._M_p._0_4_ =
                       *(uint *)((long)_Var2.
                                       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                       .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                0x10);
                  id_str._M_dataplus._M_p._4_4_ =
                       *(uint *)((long)_Var2.
                                       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                       .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                0x28);
                  std::
                  _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::_M_emplace<std::pair<unsigned_int_const,unsigned_int>>
                            ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                              *)__h,&id_str);
                }
              }
            }
            else {
              add_reg_read(this,*(Reg *)((long)_Var2.
                                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                               .super__Head_base<0UL,_arm::Inst_*,_false>.
                                               _M_head_impl + 0x10),local_168[0]);
            }
            add_reg_read(this,(Operand2 *)
                              ((long)_Var2.
                                     super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                     .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18)
                         ,local_168[0]);
          }
          else if (ppuVar3 == local_128) {
            if (*(int *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 2) {
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(local_148,(int *)local_168);
            }
          }
          else if (ppuVar3 == local_130) {
            if (*(int *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 0x1a)
            {
              add_reg_write(this,*(Reg *)((long)_Var2.
                                                super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                                .super__Head_base<0UL,_arm::Inst_*,_false>.
                                                _M_head_impl + 0x10),local_168[0]);
            }
            else {
              add_reg_read(this,*(Reg *)((long)_Var2.
                                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                               .super__Head_base<0UL,_arm::Inst_*,_false>.
                                               _M_head_impl + 0x10),local_168[0]);
            }
            if (*(char *)((long)_Var2.
                                super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x48) ==
                '\x01') {
              add_reg_read(this,(MemoryOperand *)
                                ((long)_Var2.
                                       super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                       .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                0x18),local_168[0]);
            }
          }
          else if (ppuVar3 == local_138) {
            p_Var5 = *(_Rb_tree_node_base **)
                      ((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x28);
            if (*(int *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 0x1b)
            {
              for (; p_Var5 != (_Rb_tree_node_base *)
                               ((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18
                               ); p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                add_reg_write(this,p_Var5[1]._M_color,local_168[0]);
              }
            }
            else {
              for (; p_Var5 != (_Rb_tree_node_base *)
                               ((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18
                               ); p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                add_reg_read(this,p_Var5[1]._M_color,local_168[0]);
              }
            }
            add_reg_read(this,*(Reg *)((long)_Var2.
                                             super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                             .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl
                                      + 0x40),local_168[0]);
          }
          else if (ppuVar3 == local_140) {
            p_Var5 = *(_Rb_tree_node_base **)
                      ((long)_Var2.super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                             super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x28);
            if (*(int *)((long)_Var2.
                               super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>.
                               super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 8) == 0x1e)
            {
              for (; p_Var5 != (_Rb_tree_node_base *)
                               ((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18
                               ); p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                add_reg_write(this,p_Var5[1]._M_color,local_168[0]);
              }
            }
            else {
              for (; p_Var5 != (_Rb_tree_node_base *)
                               ((long)_Var2.
                                      super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                      .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18
                               ); p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
                add_reg_read(this,p_Var5[1]._M_color,local_168[0]);
              }
            }
          }
          else if (ppuVar3 == local_150) {
            plVar6 = (long *)((long)_Var2.
                                    super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                    .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x10);
            lVar4 = std::__cxx11::string::find((char *)plVar6,0x193655);
            if (lVar4 == 0) {
              std::__cxx11::string::find_last_of((char *)plVar6,0x193fb4);
              std::__cxx11::string::substr((ulong)&id_str,(ulong)plVar6);
              local_f8[0].second = std::__cxx11::stoi(&id_str,(size_t *)0x0,10);
              local_f8[0].first = local_168[0];
              std::
              _Rb_tree<int,std::pair<int_const,unsigned_int>,std::_Select1st<std::pair<int_const,unsigned_int>>,std::less<int>,std::allocator<std::pair<int_const,unsigned_int>>>
              ::_M_insert_unique<std::pair<int_const,unsigned_int>>(local_158,local_f8);
              std::__cxx11::string::~string((string *)&id_str);
            }
          }
          goto LAB_0015eebf;
        }
        add_reg_read(this,*(Reg *)((long)_Var2.
                                         super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                         .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                  0x14),local_168[0]);
        add_reg_read(this,(Operand2 *)
                          ((long)_Var2.
                                 super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                 .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl + 0x18),
                     local_168[0]);
      }
      add_reg_write(this,*(Reg *)((long)_Var2.
                                        super___uniq_ptr_impl<arm::Inst,_std::default_delete<arm::Inst>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_arm::Inst_*,_std::default_delete<arm::Inst>_>
                                        .super__Head_base<0UL,_arm::Inst_*,_false>._M_head_impl +
                                 0x10),local_168[0]);
    }
LAB_0015eebf:
    local_168[0] = local_168[0] + 1;
  } while( true );
}

Assistant:

void RegAllocator::calc_live_intervals() {
  int curr_bb = 0;
  for (int i = 0; i < f.inst.size(); i++) {
    auto inst_ = &*f.inst[i];
    if (auto x = dynamic_cast<PureInst *>(inst_)) {
      //   noop
    } else if (auto x = dynamic_cast<Arith4Inst *>(inst_)) {
      add_reg_read(x->r1, i);
      add_reg_read(x->r2, i);
      add_reg_read(x->r3, i);
      add_reg_write(x->rd, i);
    } else if (auto x = dynamic_cast<Arith3Inst *>(inst_)) {
      add_reg_read(x->r1, i);
      add_reg_read(x->r2, i);
      add_reg_write(x->rd, i);
    } else if (auto x = dynamic_cast<Arith2Inst *>(inst_)) {
      if (x->op == arm::OpCode::Mov || x->op == arm::OpCode::MovT ||
          x->op == arm::OpCode::Mvn) {
        add_reg_write(x->r1, i);
        if (auto r2 = std::get_if<RegisterOperand>(&x->r2);
            x->op == arm::OpCode::Mov && r2 && r2->shift_amount == 0) {
          if (!is_virtual_register(x->r1) &&
              !is_virtual_register(x->r2.get_reg()))
            reg_affine.insert({x->r1, x->r2.get_reg()});
        }
      } else {
        add_reg_read(x->r1, i);
      }
      add_reg_read(x->r2, i);
    } else if (auto x = dynamic_cast<BrInst *>(inst_)) {
      if (x->op == arm::OpCode::Bl) {
        bl_points.insert(i);
      }
    } else if (auto x = dynamic_cast<LoadStoreInst *>(inst_)) {
      if (x->op == arm::OpCode::LdR) {
        add_reg_write(x->rd, i);
      } else {
        // StR
        add_reg_read(x->rd, i);
      }
      if (auto mem = std::get_if<MemoryOperand>(&x->mem)) add_reg_read(*mem, i);
    } else if (auto x = dynamic_cast<MultLoadStoreInst *>(inst_)) {
      if (x->op == arm::OpCode::LdM) {
        for (auto rd : x->rd) add_reg_write(rd, i);
      } else {
        // StM
        for (auto rd : x->rd) add_reg_read(rd, i);
      }
      add_reg_read(x->rn, i);
    } else if (auto x = dynamic_cast<PushPopInst *>(inst_)) {
      if (x->op == arm::OpCode::Push) {
        for (auto rd : x->regs) add_reg_write(rd, i);
      } else {
        // pop
        for (auto rd : x->regs) add_reg_read(rd, i);
      }
    } else if (auto x = dynamic_cast<LabelInst *>(inst_)) {
      if (x->label.find(".bb_") == 0) {
        try {
          auto bb_id_idx = x->label.find_last_of("$");
          auto id_str = x->label.substr(bb_id_idx + 1);
          auto bb_id = std::stoi(id_str);
          point_bb_map.insert({i, bb_id});
          curr_bb = bb_id;
        } catch (std::exception &i) {
          LOG(WARNING) << typeid(i).name() << ": " << i.what() << std::endl;
        }
      }
    } else
      //   noop
      ;
  }
}